

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O2

void __thiscall Transformed::Transformed(Transformed *this,Primitive *inner,mat4f *m)

{
  AABox *a;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  mat4f a_00;
  int iVar8;
  long lVar9;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  vec3f vVar10;
  undefined1 in_stack_00000000 [48];
  point local_110;
  AABox t;
  AABox local_a0;
  vec3f local_88;
  float local_7c;
  float local_78;
  float local_74;
  float fStackY_70;
  float fStackY_6c;
  float fStackY_68;
  float local_64;
  float local_60;
  float fStackY_5c;
  float fStackY_58;
  float fStackY_54;
  float local_50;
  float local_4c;
  float fStackY_48;
  float fStackY_44;
  float fStackY_40;
  float local_3c;
  float fStackY_38;
  float fStackY_34;
  float fStackY_30;
  float local_2c;
  
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_intersect_0015fd20;
  this->inner = inner;
  uVar1 = *(undefined8 *)m->data[0];
  uVar2 = *(undefined8 *)(m->data[0] + 2);
  uVar3 = *(undefined8 *)m->data[1];
  uVar4 = *(undefined8 *)(m->data[1] + 2);
  uVar5 = *(undefined8 *)m->data[2];
  uVar6 = *(undefined8 *)(m->data[2] + 2);
  uVar7 = *(undefined8 *)(m->data[3] + 2);
  *(undefined8 *)(this->trans).data[3] = *(undefined8 *)m->data[3];
  *(undefined8 *)((this->trans).data[3] + 2) = uVar7;
  *(undefined8 *)(this->trans).data[2] = uVar5;
  *(undefined8 *)((this->trans).data[2] + 2) = uVar6;
  *(undefined8 *)(this->trans).data[1] = uVar3;
  *(undefined8 *)((this->trans).data[1] + 2) = uVar4;
  *(undefined8 *)(this->trans).data[0] = uVar1;
  *(undefined8 *)((this->trans).data[0] + 2) = uVar2;
  a_00.data[0]._8_8_ = unaff_R15;
  a_00.data[0]._0_8_ = unaff_R14;
  a_00.data._16_48_ = in_stack_00000000;
  inverse(a_00);
  a = &this->bound;
  (*inner->_vptr_Primitive[1])(&t,inner);
  iVar8 = AABox::finite(&t,8.01365297814802e-315);
  if ((char)iVar8 == '\0') {
    (this->bound).z1 = -INFINITY;
    (this->bound).z2 = INFINITY;
    a->x1 = -INFINITY;
    a->x2 = INFINITY;
    (this->bound).y1 = -INFINITY;
    (this->bound).y2 = INFINITY;
  }
  else {
    local_88.x = t.x1;
    local_7c = t.x1;
    local_88.z = t.z1;
    local_74 = t.z2;
    fStackY_70 = t.x1;
    fStackY_6c = t.y2;
    fStackY_68 = t.z1;
    local_64 = t.x1;
    local_88.y = t.y1;
    local_78 = t.y1;
    local_60 = t.y2;
    fStackY_5c = t.z2;
    fStackY_58 = t.x2;
    fStackY_54 = t.y1;
    local_50 = t.z1;
    local_4c = t.x2;
    fStackY_48 = t.y1;
    fStackY_44 = t.z2;
    fStackY_40 = t.x2;
    local_3c = t.y2;
    fStackY_38 = t.z1;
    fStackY_34 = t.x2;
    fStackY_30 = t.y2;
    local_2c = t.z2;
    vVar10 = transformedPoint(&this->trans,&local_88);
    (this->bound).x1 = vVar10.x;
    (this->bound).x2 = vVar10.x;
    (this->bound).y1 = vVar10.y;
    (this->bound).y2 = vVar10.y;
    (this->bound).z1 = vVar10.z;
    (this->bound).z2 = vVar10.z;
    for (lVar9 = 0xc; lVar9 != 0x60; lVar9 = lVar9 + 0xc) {
      vVar10 = transformedPoint(&this->trans,(vec3f *)((long)&local_88.x + lVar9));
      local_110.z = vVar10.z;
      local_110._0_8_ = vVar10._0_8_;
      operator+(&local_a0,a,&local_110);
      (this->bound).z1 = local_a0.z1;
      (this->bound).z2 = local_a0.z2;
      a->x1 = local_a0.x1;
      a->x2 = local_a0.x2;
      (this->bound).y1 = local_a0.y1;
      (this->bound).y2 = local_a0.y2;
    }
  }
  return;
}

Assistant:

Transformed(Primitive* inner, const mat4f& m):
		inner(inner), trans(m), invTrans(inverse(m))
	{
		// calculate bounding box of transformed shape
		// (though this bound might be looser)
		AABox t = inner->boundingVolume();
		if (t.finite()) {
			point boundpoints[] = {
				vec3f(t.x1, t.y1, t.z1),
				vec3f(t.x1, t.y1, t.z2),
				vec3f(t.x1, t.y2, t.z1),
				vec3f(t.x1, t.y2, t.z2),
				vec3f(t.x2, t.y1, t.z1),
				vec3f(t.x2, t.y1, t.z2),
				vec3f(t.x2, t.y2, t.z1),
				vec3f(t.x2, t.y2, t.z2)
			};
			bound = AABox(transformedPoint(trans, boundpoints[0]));
			for (int i=1; i<8; ++i)
				bound = bound + transformedPoint(trans, boundpoints[i]);
		}
		else {
			bound = AABox::infAAB;
		}
	}